

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jp2.c
# Opt level: O3

OPJ_BOOL opj_jp2_setup_encoder
                   (opj_jp2_t *jp2,opj_cparameters_t *parameters,opj_image_t *image,
                   opj_event_mgr_t *p_manager)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  short sVar5;
  uint uVar6;
  opj_image_comp_t *poVar7;
  OPJ_BOOL OVar8;
  OPJ_UINT32 OVar9;
  OPJ_UINT32 *pOVar10;
  opj_jp2_comps_t *poVar11;
  ulong uVar12;
  opj_jp2_cdef_t *poVar13;
  opj_jp2_cdef_info_t *poVar14;
  OPJ_UINT16 *pOVar15;
  uint uVar16;
  char *pcVar17;
  ulong uVar18;
  int iVar19;
  ulong uVar20;
  short *psVar21;
  long lVar22;
  
  if (image == (opj_image_t *)0x0 ||
      (parameters == (opj_cparameters_t *)0x0 || jp2 == (opj_jp2_t *)0x0)) {
    return 0;
  }
  if (image->numcomps - 0x4001 < 0xffffc000) {
    pcVar17 = "Invalid number of components specified while setting up JP2 encoder\n";
    goto LAB_0011d3e1;
  }
  OVar8 = opj_j2k_setup_encoder(jp2->j2k,parameters,image,p_manager);
  if (OVar8 == 0) {
    return 0;
  }
  jp2->brand = 0x6a703220;
  jp2->minversion = 0;
  jp2->numcl = 1;
  pOVar10 = (OPJ_UINT32 *)opj_malloc(4);
  jp2->cl = pOVar10;
  if (pOVar10 != (OPJ_UINT32 *)0x0) {
    *pOVar10 = 0x6a703220;
    uVar6 = image->numcomps;
    jp2->numcomps = uVar6;
    poVar11 = (opj_jp2_comps_t *)opj_malloc((ulong)uVar6 * 0xc);
    jp2->comps = poVar11;
    if (poVar11 != (opj_jp2_comps_t *)0x0) {
      uVar1 = image->x1;
      uVar3 = image->y1;
      uVar2 = image->x0;
      uVar4 = image->y0;
      jp2->w = uVar1 - uVar2;
      jp2->h = uVar3 - uVar4;
      poVar7 = image->comps;
      OVar9 = poVar7->prec;
      jp2->bpc = (poVar7->sgnd * 0x80 + OVar9) - 1;
      uVar6 = image->numcomps;
      uVar18 = (ulong)uVar6;
      if (1 < uVar18) {
        lVar22 = 0;
        do {
          if (OVar9 != *(OPJ_UINT32 *)((long)&poVar7[1].prec + lVar22)) {
            jp2->bpc = 0xff;
          }
          lVar22 = lVar22 + 0x40;
        } while (uVar18 * 0x40 + -0x40 != lVar22);
      }
      jp2->C = 7;
      jp2->UnkC = 0;
      jp2->IPR = 0;
      if (uVar18 != 0) {
        pOVar10 = &poVar7->sgnd;
        lVar22 = 0;
        do {
          *(OPJ_UINT32 *)((long)&poVar11->bpcc + lVar22) = pOVar10[-2] + *pOVar10 * 0x80 + -1;
          pOVar10 = pOVar10 + 0x10;
          lVar22 = lVar22 + 0xc;
        } while (uVar18 * 0xc != lVar22);
      }
      if (image->icc_profile_len == 0) {
        jp2->meth = 1;
        if ((uint)(image->color_space + OPJ_CLRSPC_UNKNOWN) < 3) {
          OVar9 = image->color_space + 0xf;
          goto LAB_0011d41a;
        }
      }
      else {
        jp2->meth = 2;
        OVar9 = 0;
LAB_0011d41a:
        jp2->enumcs = OVar9;
      }
      if (uVar18 != 0) {
        pOVar15 = &poVar7->alpha;
        uVar20 = 0;
        uVar12 = 0;
        iVar19 = 0;
        do {
          if (*pOVar15 != 0) {
            uVar12 = uVar20 & 0xffffffff;
          }
          iVar19 = iVar19 + (uint)(*pOVar15 != 0);
          uVar20 = uVar20 + 1;
          pOVar15 = pOVar15 + 0x20;
        } while (uVar18 != uVar20);
        if (iVar19 == 0) goto LAB_0011d4a9;
        if (iVar19 == 1) {
          uVar16 = jp2->enumcs - 0x10;
          if (uVar16 < 3) {
            uVar16 = *(uint *)(&DAT_00141378 + (ulong)uVar16 * 4);
            if (uVar16 < uVar6) {
              if (uVar16 <= (uint)uVar12) {
                poVar13 = (opj_jp2_cdef_t *)opj_malloc(0x10);
                (jp2->color).jp2_cdef = poVar13;
                if (poVar13 != (opj_jp2_cdef_t *)0x0) {
                  poVar14 = (opj_jp2_cdef_info_t *)opj_malloc((ulong)image->numcomps * 6);
                  poVar13 = (jp2->color).jp2_cdef;
                  poVar13->info = poVar14;
                  if (poVar14 != (opj_jp2_cdef_info_t *)0x0) {
                    uVar6 = image->numcomps;
                    poVar13->n = (OPJ_UINT16)uVar6;
                    pOVar15 = &poVar14->asoc;
                    lVar22 = -0x38;
                    uVar18 = 0;
                    do {
                      ((opj_jp2_cdef_info_t *)(pOVar15 + -2))->cn = (ushort)uVar18;
                      pOVar15[-1] = 0;
                      uVar18 = uVar18 + 1;
                      *pOVar15 = (ushort)uVar18;
                      lVar22 = lVar22 + -0x40;
                      pOVar15 = pOVar15 + 3;
                    } while (uVar16 != uVar18);
                    if (uVar16 < uVar6) {
                      psVar21 = (short *)((long)image->comps - lVar22);
                      do {
                        sVar5 = *psVar21;
                        ((opj_jp2_cdef_info_t *)(pOVar15 + -2))->cn = (ushort)uVar18;
                        pOVar15[-1] = -(ushort)(sVar5 == 0) | 1;
                        *pOVar15 = -(ushort)(sVar5 == 0);
                        uVar18 = uVar18 + 1;
                        pOVar15 = pOVar15 + 3;
                        psVar21 = psVar21 + 0x20;
                      } while (uVar18 < uVar6);
                    }
                    goto LAB_0011d4a9;
                  }
                }
                pcVar17 = "Not enough memory to setup the JP2 encoder\n";
                goto LAB_0011d3e1;
              }
              pcVar17 = 
              "Alpha channel position conflicts with color channel. No cdef box will be created.\n";
            }
            else {
              pcVar17 = 
              "Alpha channel specified but not enough image components for an automatic cdef box creation.\n"
              ;
            }
          }
          else {
            pcVar17 = "Alpha channel specified but unknown enumcs. No cdef box will be created.\n";
          }
        }
        else {
          pcVar17 = "Multiple alpha channels specified. No cdef box will be created.\n";
        }
        opj_event_msg(p_manager,2,pcVar17);
      }
LAB_0011d4a9:
      jp2->precedence = 0;
      jp2->approx = 0;
      jp2->jpip_on = parameters->jpip_on;
      return 1;
    }
  }
  pcVar17 = "Not enough memory when setup the JP2 encoder\n";
LAB_0011d3e1:
  opj_event_msg(p_manager,1,pcVar17);
  return 0;
}

Assistant:

OPJ_BOOL opj_jp2_setup_encoder(opj_jp2_t *jp2,
                               opj_cparameters_t *parameters,
                               opj_image_t *image,
                               opj_event_mgr_t * p_manager)
{
    OPJ_UINT32 i;
    OPJ_UINT32 depth_0;
    OPJ_UINT32 sign;
    OPJ_UINT32 alpha_count;
    OPJ_UINT32 color_channels = 0U;
    OPJ_UINT32 alpha_channel = 0U;


    if (!jp2 || !parameters || !image) {
        return OPJ_FALSE;
    }

    /* setup the J2K codec */
    /* ------------------- */

    /* Check if number of components respects standard */
    if (image->numcomps < 1 || image->numcomps > 16384) {
        opj_event_msg(p_manager, EVT_ERROR,
                      "Invalid number of components specified while setting up JP2 encoder\n");
        return OPJ_FALSE;
    }

    if (opj_j2k_setup_encoder(jp2->j2k, parameters, image,
                              p_manager) == OPJ_FALSE) {
        return OPJ_FALSE;
    }

    /* setup the JP2 codec */
    /* ------------------- */

    /* Profile box */

    jp2->brand = JP2_JP2;   /* BR */
    jp2->minversion = 0;    /* MinV */
    jp2->numcl = 1;
    jp2->cl = (OPJ_UINT32*) opj_malloc(jp2->numcl * sizeof(OPJ_UINT32));
    if (!jp2->cl) {
        opj_event_msg(p_manager, EVT_ERROR,
                      "Not enough memory when setup the JP2 encoder\n");
        return OPJ_FALSE;
    }
    jp2->cl[0] = JP2_JP2;   /* CL0 : JP2 */

    /* Image Header box */

    jp2->numcomps = image->numcomps;    /* NC */
    jp2->comps = (opj_jp2_comps_t*) opj_malloc(jp2->numcomps * sizeof(
                     opj_jp2_comps_t));
    if (!jp2->comps) {
        opj_event_msg(p_manager, EVT_ERROR,
                      "Not enough memory when setup the JP2 encoder\n");
        /* Memory of jp2->cl will be freed by opj_jp2_destroy */
        return OPJ_FALSE;
    }

    jp2->h = image->y1 - image->y0;     /* HEIGHT */
    jp2->w = image->x1 - image->x0;     /* WIDTH */
    /* BPC */
    depth_0 = image->comps[0].prec - 1;
    sign = image->comps[0].sgnd;
    jp2->bpc = depth_0 + (sign << 7);
    for (i = 1; i < image->numcomps; i++) {
        OPJ_UINT32 depth = image->comps[i].prec - 1;
        sign = image->comps[i].sgnd;
        if (depth_0 != depth) {
            jp2->bpc = 255;
        }
    }
    jp2->C = 7;         /* C : Always 7 */
    jp2->UnkC = 0;      /* UnkC, colorspace specified in colr box */
    jp2->IPR = 0;       /* IPR, no intellectual property */

    /* BitsPerComponent box */
    for (i = 0; i < image->numcomps; i++) {
        jp2->comps[i].bpcc = image->comps[i].prec - 1 + (image->comps[i].sgnd << 7);
    }

    /* Colour Specification box */
    if (image->icc_profile_len) {
        jp2->meth = 2;
        jp2->enumcs = 0;
    } else {
        jp2->meth = 1;
        if (image->color_space == 1) {
            jp2->enumcs = 16;    /* sRGB as defined by IEC 61966-2-1 */
        } else if (image->color_space == 2) {
            jp2->enumcs = 17;    /* greyscale */
        } else if (image->color_space == 3) {
            jp2->enumcs = 18;    /* YUV */
        }
    }

    /* Channel Definition box */
    /* FIXME not provided by parameters */
    /* We try to do what we can... */
    alpha_count = 0U;
    for (i = 0; i < image->numcomps; i++) {
        if (image->comps[i].alpha != 0) {
            alpha_count++;
            alpha_channel = i;
        }
    }
    if (alpha_count == 1U) { /* no way to deal with more than 1 alpha channel */
        switch (jp2->enumcs) {
        case 16:
        case 18:
            color_channels = 3;
            break;
        case 17:
            color_channels = 1;
            break;
        default:
            alpha_count = 0U;
            break;
        }
        if (alpha_count == 0U) {
            opj_event_msg(p_manager, EVT_WARNING,
                          "Alpha channel specified but unknown enumcs. No cdef box will be created.\n");
        } else if (image->numcomps < (color_channels + 1)) {
            opj_event_msg(p_manager, EVT_WARNING,
                          "Alpha channel specified but not enough image components for an automatic cdef box creation.\n");
            alpha_count = 0U;
        } else if ((OPJ_UINT32)alpha_channel < color_channels) {
            opj_event_msg(p_manager, EVT_WARNING,
                          "Alpha channel position conflicts with color channel. No cdef box will be created.\n");
            alpha_count = 0U;
        }
    } else if (alpha_count > 1) {
        opj_event_msg(p_manager, EVT_WARNING,
                      "Multiple alpha channels specified. No cdef box will be created.\n");
    }
    if (alpha_count == 1U) { /* if here, we know what we can do */
        jp2->color.jp2_cdef = (opj_jp2_cdef_t*)opj_malloc(sizeof(opj_jp2_cdef_t));
        if (!jp2->color.jp2_cdef) {
            opj_event_msg(p_manager, EVT_ERROR,
                          "Not enough memory to setup the JP2 encoder\n");
            return OPJ_FALSE;
        }
        /* no memset needed, all values will be overwritten except if jp2->color.jp2_cdef->info allocation fails, */
        /* in which case jp2->color.jp2_cdef->info will be NULL => valid for destruction */
        jp2->color.jp2_cdef->info = (opj_jp2_cdef_info_t*) opj_malloc(
                                        image->numcomps * sizeof(opj_jp2_cdef_info_t));
        if (!jp2->color.jp2_cdef->info) {
            /* memory will be freed by opj_jp2_destroy */
            opj_event_msg(p_manager, EVT_ERROR,
                          "Not enough memory to setup the JP2 encoder\n");
            return OPJ_FALSE;
        }
        jp2->color.jp2_cdef->n = (OPJ_UINT16)
                                 image->numcomps; /* cast is valid : image->numcomps [1,16384] */
        for (i = 0U; i < color_channels; i++) {
            jp2->color.jp2_cdef->info[i].cn = (OPJ_UINT16)
                                              i; /* cast is valid : image->numcomps [1,16384] */
            jp2->color.jp2_cdef->info[i].typ = 0U;
            jp2->color.jp2_cdef->info[i].asoc = (OPJ_UINT16)(i +
                                                1U); /* No overflow + cast is valid : image->numcomps [1,16384] */
        }
        for (; i < image->numcomps; i++) {
            if (image->comps[i].alpha != 0) { /* we'll be here exactly once */
                jp2->color.jp2_cdef->info[i].cn = (OPJ_UINT16)
                                                  i; /* cast is valid : image->numcomps [1,16384] */
                jp2->color.jp2_cdef->info[i].typ = 1U; /* Opacity channel */
                jp2->color.jp2_cdef->info[i].asoc =
                    0U; /* Apply alpha channel to the whole image */
            } else {
                /* Unknown channel */
                jp2->color.jp2_cdef->info[i].cn = (OPJ_UINT16)
                                                  i; /* cast is valid : image->numcomps [1,16384] */
                jp2->color.jp2_cdef->info[i].typ = 65535U;
                jp2->color.jp2_cdef->info[i].asoc = 65535U;
            }
        }
    }

    jp2->precedence = 0;    /* PRECEDENCE */
    jp2->approx = 0;        /* APPROX */

    jp2->jpip_on = parameters->jpip_on;

    return OPJ_TRUE;
}